

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace.c
# Opt level: O1

void workspace_destroy(workspace *workspace)

{
  node *pnVar1;
  
  if (workspace->clients != (list *)0x0) {
    for (pnVar1 = workspace->clients->head; pnVar1 != (node *)0x0; pnVar1 = pnVar1->next) {
      client_destroy((client *)pnVar1->data);
    }
    list_destroy(workspace->clients);
  }
  free(workspace);
  return;
}

Assistant:

void workspace_destroy(struct workspace *workspace)
{
        if (workspace->clients != NULL) {
                LIST_FOR_EACH(workspace->clients, node)
                {
                        struct client *client = get_client_from_client_node(node);

                        client_destroy(client);
                }

                list_destroy(workspace->clients);
        }

        free(workspace);
}